

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

UBool __thiscall
icu_63::FractionalPartSubstitution::doParse
          (FractionalPartSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,
          double baseValue,double param_4,UBool lenientParse,uint32_t nonNumericalExecutedRuleMask,
          Formattable *resVal)

{
  int8_t value;
  UBool UVar1;
  char16_t cVar2;
  undefined4 uVar3;
  NumberFormat *pNVar5;
  int iVar6;
  double dVar7;
  double d;
  UErrorCode status;
  NumberFormat *local_168;
  ParsePosition workPos;
  UnicodeString workText;
  DecimalQuantity dl;
  Formattable temp;
  int32_t iVar4;
  
  if (this->byDigits == '\0') {
    UVar1 = NFSubstitution::doParse
                      (&this->super_NFSubstitution,text,parsePosition,baseValue,0.0,lenientParse,
                       nonNumericalExecutedRuleMask,resVal);
    return UVar1;
  }
  UnicodeString::UnicodeString(&workText,text);
  workPos.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003e2fe8;
  workPos.index = 1;
  workPos.errorIndex = -1;
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&dl);
  iVar6 = 0;
  local_168 = (NumberFormat *)0x0;
  do {
    uVar3 = workText.fUnion.fFields.fLength;
    if (-1 < workText.fUnion.fStackFields.fLengthAndFlags) {
      uVar3 = (int)workText.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (((int)uVar3 < 1) || (workPos.index == 0)) {
      if (local_168 != (NumberFormat *)0x0) {
        (*(local_168->super_Format).super_UObject._vptr_UObject[1])();
      }
      icu_63::number::impl::DecimalQuantity::adjustMagnitude(&dl,-iVar6);
      dVar7 = icu_63::number::impl::DecimalQuantity::toDouble(&dl);
      (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xb])(dVar7,baseValue);
      Formattable::setDouble(resVal,d);
      icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&dl);
      ParsePosition::~ParsePosition(&workPos);
      UnicodeString::~UnicodeString(&workText);
      return '\x01';
    }
    workPos._8_8_ = workPos._8_8_ & 0xffffffff00000000;
    Formattable::Formattable(&temp);
    NFRuleSet::parse((this->super_NFSubstitution).ruleSet,&workText,&workPos,10.0,
                     nonNumericalExecutedRuleMask,&temp);
    status = U_ZERO_ERROR;
    iVar4 = Formattable::getLong(&temp,&status);
    value = (int8_t)iVar4;
    if (lenientParse == '\0') {
LAB_0025f86b:
      if (workPos.index != 0) goto LAB_0025f872;
    }
    else {
      if (workPos.index == 0) {
        pNVar5 = local_168;
        if (local_168 == (NumberFormat *)0x0) {
          status = U_ZERO_ERROR;
          pNVar5 = NumberFormat::createInstance(&status);
          if (status < U_ILLEGAL_ARGUMENT_ERROR) {
            if (pNVar5 != (NumberFormat *)0x0) goto LAB_0025f809;
          }
          else if (pNVar5 != (NumberFormat *)0x0) {
            (*(pNVar5->super_Format).super_UObject._vptr_UObject[1])(pNVar5);
          }
          local_168 = (NumberFormat *)0x0;
        }
        else {
LAB_0025f809:
          local_168 = pNVar5;
          (*(pNVar5->super_Format).super_UObject._vptr_UObject[0x14])
                    (pNVar5,&workText,&temp,&workPos);
          iVar4 = Formattable::getLong(&temp,&status);
          value = (int8_t)iVar4;
        }
        goto LAB_0025f86b;
      }
LAB_0025f872:
      icu_63::number::impl::DecimalQuantity::appendDigit(&dl,value,0,true);
      parsePosition->index = parsePosition->index + workPos.index;
      UnicodeString::removeBetween(&workText,0,workPos.index);
      iVar6 = iVar6 + 1;
      while( true ) {
        uVar3 = workText.fUnion.fFields.fLength;
        if (-1 < workText.fUnion.fStackFields.fLengthAndFlags) {
          uVar3 = (int)workText.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (((int)uVar3 < 1) || (cVar2 = UnicodeString::doCharAt(&workText,0), cVar2 != L' '))
        break;
        UnicodeString::removeBetween(&workText,0,1);
        parsePosition->index = parsePosition->index + 1;
      }
    }
    Formattable::~Formattable(&temp);
  } while( true );
}

Assistant:

UBool
FractionalPartSubstitution::doParse(const UnicodeString& text,
                ParsePosition& parsePosition,
                double baseValue,
                double /*upperBound*/,
                UBool lenientParse,
                uint32_t nonNumericalExecutedRuleMask,
                Formattable& resVal) const
{
    // if we're not in byDigits mode, we can just use the inherited
    // doParse()
    if (!byDigits) {
        return NFSubstitution::doParse(text, parsePosition, baseValue, 0, lenientParse, nonNumericalExecutedRuleMask, resVal);

        // if we ARE in byDigits mode, parse the text one digit at a time
        // using this substitution's owning rule set (we do this by setting
        // upperBound to 10 when calling doParse() ) until we reach
        // nonmatching text
    } else {
        UnicodeString workText(text);
        ParsePosition workPos(1);
        double result = 0;
        int32_t digit;
//          double p10 = 0.1;

        DecimalQuantity dl;
        int32_t totalDigits = 0;
        NumberFormat* fmt = NULL;
        while (workText.length() > 0 && workPos.getIndex() != 0) {
            workPos.setIndex(0);
            Formattable temp;
            getRuleSet()->parse(workText, workPos, 10, nonNumericalExecutedRuleMask, temp);
            UErrorCode status = U_ZERO_ERROR;
            digit = temp.getLong(status);
//            digit = temp.getType() == Formattable::kLong ?
//               temp.getLong() :
//            (int32_t)temp.getDouble();

            if (lenientParse && workPos.getIndex() == 0) {
                if (!fmt) {
                    status = U_ZERO_ERROR;
                    fmt = NumberFormat::createInstance(status);
                    if (U_FAILURE(status)) {
                        delete fmt;
                        fmt = NULL;
                    }
                }
                if (fmt) {
                    fmt->parse(workText, temp, workPos);
                    digit = temp.getLong(status);
                }
            }

            if (workPos.getIndex() != 0) {
                dl.appendDigit(static_cast<int8_t>(digit), 0, true);
                totalDigits++;
//                  result += digit * p10;
//                  p10 /= 10;
                parsePosition.setIndex(parsePosition.getIndex() + workPos.getIndex());
                workText.removeBetween(0, workPos.getIndex());
                while (workText.length() > 0 && workText.charAt(0) == gSpace) {
                    workText.removeBetween(0, 1);
                    parsePosition.setIndex(parsePosition.getIndex() + 1);
                }
            }
        }
        delete fmt;

        dl.adjustMagnitude(-totalDigits);
        result = dl.toDouble();
        result = composeRuleValue(result, baseValue);
        resVal.setDouble(result);
        return TRUE;
    }
}